

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct_x86_avx::destroy_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  if (this->flatten != (Layer *)0x0) {
    (*this->flatten->_vptr_Layer[5])();
    if (this->flatten != (Layer *)0x0) {
      (*this->flatten->_vptr_Layer[1])();
    }
    this->flatten = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::destroy_pipeline(const Option& opt)
{
    if (flatten)
    {
        flatten->destroy_pipeline(opt);
        delete flatten;
        flatten = 0;
    }

    return 0;
}